

Human: Reconstruct the original C/C++ source from this Ghidra decompilation:

# music_gme.cpp
# Opt level: O1

int __thiscall GMESong::CalcSongLength(GMESong *this)

{
  gme_info_t *pgVar1;
  int iVar2;
  
  pgVar1 = this->TrackInfo;
  iVar2 = 150000;
  if ((pgVar1 != (gme_info_t *)0x0) && (iVar2 = pgVar1->length, iVar2 < 1)) {
    iVar2 = 150000;
    if (0 < pgVar1->loop_length) {
      return pgVar1->loop_length * 2 + pgVar1->intro_length;
    }
  }
  return iVar2;
}

Assistant:

int GMESong::CalcSongLength()
{
	if (TrackInfo == NULL)
	{
		return 150000;
	}
	if (TrackInfo->length > 0)
	{
		return TrackInfo->length;
	}
	if (TrackInfo->loop_length > 0)
	{
		return TrackInfo->intro_length + TrackInfo->loop_length * 2;
	}
	return 150000;
}